

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Value * parse_value(char **string,size_t nesting)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  JSON_Status JVar6;
  ushort **ppuVar7;
  int *piVar8;
  void *pvVar9;
  JSON_Value *pJVar10;
  char *pcVar11;
  char *pcVar12;
  JSON_Value *pJVar13;
  ulong uVar14;
  size_t new_capacity;
  byte *pbVar15;
  double dVar16;
  JSON_Array *array;
  char *local_48;
  JSON_Object *local_40;
  double local_38;
  
  if (0x800 < nesting) {
    return (JSON_Value *)0x0;
  }
  ppuVar7 = __ctype_b_loc();
  pbVar15 = (byte *)*string;
  bVar1 = *pbVar15;
  bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
  while ((bVar2 & 0x20) != 0) {
    pbVar15 = pbVar15 + 1;
    *string = (char *)pbVar15;
    bVar1 = *pbVar15;
    bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
  }
  uVar4 = (uint)bVar1;
  if (bVar1 < 0x5b) {
    if (9 < uVar4 - 0x30) {
      if (uVar4 == 0x22) {
        local_48 = (char *)0x0;
        pcVar11 = get_quoted_string(string,(size_t *)&local_48);
        pcVar3 = local_48;
        if (pcVar11 == (char *)0x0) {
          return (JSON_Value *)0x0;
        }
        pJVar10 = (JSON_Value *)(*parson_malloc)(0x20);
        if (pJVar10 == (JSON_Value *)0x0) {
          pJVar10 = (JSON_Value *)0x0;
        }
        else {
          pJVar10->parent = (JSON_Value *)0x0;
          pJVar10->type = 2;
          (pJVar10->value).string.chars = pcVar11;
          (pJVar10->value).string.length = (size_t)pcVar3;
        }
        if (pJVar10 == (JSON_Value *)0x0) {
          (*parson_free)(pcVar11);
          return (JSON_Value *)0x0;
        }
        return pJVar10;
      }
      if (uVar4 != 0x2d) {
        return (JSON_Value *)0x0;
      }
    }
    piVar8 = __errno_location();
    *piVar8 = 0;
    local_38 = strtod((char *)pbVar15,&local_48);
    iVar5 = *piVar8;
    dVar16 = ABS(local_38);
    if ((iVar5 == 0x22) && (dVar16 == INFINITY)) {
      return (JSON_Value *)0x0;
    }
    if ((iVar5 != 0x22) && (iVar5 != 0)) {
      return (JSON_Value *)0x0;
    }
    pcVar3 = *string;
    uVar14 = (long)local_48 - (long)pcVar3;
    if (((1 < uVar14) && (*pcVar3 == '0')) && (pcVar3[1] != '.')) {
      return (JSON_Value *)0x0;
    }
    if (((2 < uVar14) && (iVar5 = strncmp(pcVar3,"-0",2), iVar5 == 0)) && (pcVar3[2] != '.')) {
      return (JSON_Value *)0x0;
    }
    local_40 = (JSON_Object *)local_48;
    while (uVar14 != 0) {
      pvVar9 = memchr("xX",(int)pcVar3[uVar14 - 1],3);
      uVar14 = uVar14 - 1;
      if (pvVar9 != (void *)0x0) {
        return (JSON_Value *)0x0;
      }
    }
    *string = (char *)local_40;
    if (0x7fefffffffffffff < (ulong)dVar16) {
      return (JSON_Value *)0x0;
    }
    pJVar10 = (JSON_Value *)(*parson_malloc)(0x20);
    if (pJVar10 == (JSON_Value *)0x0) {
      return (JSON_Value *)0x0;
    }
    pJVar10->parent = (JSON_Value *)0x0;
    pJVar10->type = 3;
    (pJVar10->value).number = local_38;
    return pJVar10;
  }
  if (bVar1 < 0x6e) {
    if (uVar4 == 0x5b) {
      pJVar10 = json_value_init_array();
      if (pJVar10 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
      if (**string == '[') {
        if (pJVar10->type == 5) {
          array = (pJVar10->value).array;
        }
        else {
          array = (JSON_Array *)0x0;
        }
        pbVar15 = (byte *)(*string + 1);
        do {
          *string = (char *)pbVar15;
          bVar1 = *pbVar15;
          pbVar15 = pbVar15 + 1;
        } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        if (bVar1 == 0x5d) goto LAB_001532d3;
        while (**string != '\0') {
          pJVar13 = parse_value(string,nesting + 1);
          if (pJVar13 == (JSON_Value *)0x0) goto LAB_001532f6;
          JVar6 = json_array_add(array,pJVar13);
          if (JVar6 != 0) {
            json_value_free(pJVar13);
            goto LAB_001532f6;
          }
          pbVar15 = (byte *)*string;
          bVar1 = *pbVar15;
          bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
          while ((bVar2 & 0x20) != 0) {
            pbVar15 = pbVar15 + 1;
            *string = (char *)pbVar15;
            bVar1 = *pbVar15;
            bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
          }
          if (bVar1 != 0x2c) break;
          do {
            pbVar15 = pbVar15 + 1;
            *string = (char *)pbVar15;
          } while ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar15 * 2 + 1) & 0x20) != 0);
        }
        pbVar15 = (byte *)*string;
        bVar1 = *pbVar15;
        bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
        while ((bVar2 & 0x20) != 0) {
          pbVar15 = pbVar15 + 1;
          *string = (char *)pbVar15;
          bVar1 = *pbVar15;
          bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
        }
        if (bVar1 == 0x5d) {
          if (array == (JSON_Array *)0x0) {
            new_capacity = 0;
          }
          else {
            new_capacity = array->count;
          }
          JVar6 = json_array_resize(array,new_capacity);
          if (JVar6 == 0) {
            *string = *string + 1;
            return pJVar10;
          }
        }
      }
      goto LAB_001532f6;
    }
    if (uVar4 != 0x66) {
      return (JSON_Value *)0x0;
    }
  }
  else {
    if (uVar4 == 0x6e) {
      iVar5 = strncmp("null",(char *)pbVar15,4);
      if (iVar5 != 0) {
        return (JSON_Value *)0x0;
      }
      *string = (char *)(pbVar15 + 4);
      pJVar10 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar10 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
      pJVar10->parent = (JSON_Value *)0x0;
      pJVar10->type = 1;
      return pJVar10;
    }
    if (uVar4 != 0x74) {
      if (uVar4 != 0x7b) {
        return (JSON_Value *)0x0;
      }
      pJVar10 = json_value_init_object();
      if (pJVar10 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
      if (**string != '{') {
LAB_001532f6:
        json_value_free(pJVar10);
        return (JSON_Value *)0x0;
      }
      if (pJVar10->type == 4) {
        local_40 = (JSON_Object *)(pJVar10->value).string.chars;
      }
      else {
        local_40 = (JSON_Object *)0x0;
      }
      pbVar15 = (byte *)(*string + 1);
      do {
        *string = (char *)pbVar15;
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
      if (bVar1 != 0x7d) {
        do {
          if (**string == '\0') goto LAB_001532a2;
          local_48 = (char *)0x0;
          pcVar11 = get_quoted_string(string,(size_t *)&local_48);
          pcVar3 = local_48;
          if (pcVar11 == (char *)0x0) goto LAB_001531f5;
          pcVar12 = (char *)strlen(pcVar11);
          if (pcVar3 == pcVar12) {
            pbVar15 = (byte *)*string;
            bVar1 = *pbVar15;
            bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
            while ((bVar2 & 0x20) != 0) {
              pbVar15 = pbVar15 + 1;
              *string = (char *)pbVar15;
              bVar1 = *pbVar15;
              bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
            }
            if (bVar1 != 0x3a) goto LAB_001531de;
            *string = (char *)(pbVar15 + 1);
            pJVar13 = parse_value(string,nesting + 1);
            if (pJVar13 == (JSON_Value *)0x0) {
              (*parson_free)(pcVar11);
              goto LAB_001531f5;
            }
            JVar6 = json_object_add(local_40,pcVar11,pJVar13);
            if (JVar6 != 0) {
              (*parson_free)(pcVar11);
              json_value_free(pJVar13);
              goto LAB_001531f5;
            }
            pbVar15 = (byte *)*string;
            bVar1 = *pbVar15;
            bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
            while ((bVar2 & 0x20) != 0) {
              pbVar15 = pbVar15 + 1;
              *string = (char *)pbVar15;
              bVar1 = *pbVar15;
              bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
            }
            iVar5 = 5;
            if (bVar1 == 0x2c) {
              do {
                pbVar15 = pbVar15 + 1;
                *string = (char *)pbVar15;
                iVar5 = 0;
              } while ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar15 * 2 + 1) & 0x20) != 0);
            }
          }
          else {
LAB_001531de:
            (*parson_free)(pcVar11);
LAB_001531f5:
            json_value_free(pJVar10);
            iVar5 = 1;
          }
        } while (iVar5 == 0);
        if (iVar5 != 5) {
          return (JSON_Value *)0x0;
        }
LAB_001532a2:
        pbVar15 = (byte *)*string;
        bVar1 = *pbVar15;
        bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
        while ((bVar2 & 0x20) != 0) {
          pbVar15 = pbVar15 + 1;
          *string = (char *)pbVar15;
          bVar1 = *pbVar15;
          bVar2 = *(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1);
        }
        if (bVar1 != 0x7d) goto LAB_001532f6;
        pbVar15 = pbVar15 + 1;
      }
LAB_001532d3:
      *string = (char *)pbVar15;
      return pJVar10;
    }
  }
  iVar5 = strncmp("true",(char *)pbVar15,4);
  if (iVar5 == 0) {
    *string = (char *)(pbVar15 + 4);
    pJVar10 = (JSON_Value *)(*parson_malloc)(0x20);
    if (pJVar10 == (JSON_Value *)0x0) {
      return (JSON_Value *)0x0;
    }
    pJVar10->parent = (JSON_Value *)0x0;
    pJVar10->type = 6;
    (pJVar10->value).boolean = 1;
    return pJVar10;
  }
  iVar5 = strncmp("false",(char *)pbVar15,5);
  if (iVar5 != 0) {
    return (JSON_Value *)0x0;
  }
  *string = (char *)(pbVar15 + 5);
  pJVar10 = (JSON_Value *)(*parson_malloc)(0x20);
  if (pJVar10 == (JSON_Value *)0x0) {
    return (JSON_Value *)0x0;
  }
  pJVar10->parent = (JSON_Value *)0x0;
  pJVar10->type = 6;
  (pJVar10->value).boolean = 0;
  return pJVar10;
}

Assistant:

static JSON_Value * parse_value(const char **string, size_t nesting) {
    if (nesting > MAX_NESTING) {
        return NULL;
    }
    SKIP_WHITESPACES(string);
    switch (**string) {
        case '{':
            return parse_object_value(string, nesting + 1);
        case '[':
            return parse_array_value(string, nesting + 1);
        case '\"':
            return parse_string_value(string);
        case 'f': case 't':
            return parse_boolean_value(string);
        case '-':
        case '0': case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
            return parse_number_value(string);
        case 'n':
            return parse_null_value(string);
        default:
            return NULL;
    }
}